

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::GetSseSum8x8QuadTest_MinSseSum_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::GetSseSum8x8QuadTest_MinSseSum_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<(anonymous_namespace)::TestParams<void(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_int*,int*,unsigned_int*,int*,unsigned_int*)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x60);
  Test::Test(this_00);
  *(undefined4 *)
   &this_00[1].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0xbaba;
  this_00[3]._vptr_Test = (_func_int **)0x0;
  this_00[4].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  *(undefined1 *)((long)&this_00[5]._vptr_Test + 4) = 0;
  *(undefined4 *)&this_00[5]._vptr_Test = 8;
  this_00[3].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x100000001;
  *(undefined4 *)&this_00[4]._vptr_Test = 1;
  *(undefined4 *)
   &this_00[5].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0xff;
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_010bfc28;
  this_00[1]._vptr_Test = (_func_int **)&DAT_010bfc68;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }